

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParsePickList(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  Bool BVar1;
  Bool local_24;
  TidyOptionImpl *pTStack_20;
  uint value;
  TidyOptionImpl *entry_local;
  TidyDocImpl *doc_local;
  
  pTStack_20 = entry;
  entry_local = (TidyOptionImpl *)doc;
  BVar1 = GetParsePickListValue(doc,entry,&local_24);
  if (BVar1 == no) {
    prvTidyReportBadArgument((TidyDocImpl *)entry_local,pTStack_20->name);
    doc_local._4_4_ = no;
  }
  else {
    if (pTStack_20->type == TidyBoolean) {
      prvTidySetOptionBool((TidyDocImpl *)entry_local,pTStack_20->id,local_24);
    }
    else if (pTStack_20->type == TidyInteger) {
      prvTidySetOptionInt((TidyDocImpl *)entry_local,pTStack_20->id,(ulong)local_24);
    }
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool ParsePickList( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    uint value;
    
    if ( GetParsePickListValue( doc, entry, &value ) )
    {
        if ( entry->type == TidyBoolean )
            TY_(SetOptionBool)( doc, entry->id, value );
        else if ( entry->type == TidyInteger )
            TY_(SetOptionInt)( doc, entry->id, value );
        return yes;
    }
  
    TY_(ReportBadArgument)( doc, entry->name );
    return no;
}